

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcodeBlockSig
          (BinaryReaderObjdumpDisassemble *this,Type sig_type)

{
  Type in_RDX;
  string local_30;
  
  if (this->in_function_body == true) {
    if (sig_type.enum_ == Void) {
      LogOpcode(this,(char *)0x0);
    }
    else {
      (anonymous_namespace)::BinaryReaderObjdumpDisassemble::BlockSigToString_abi_cxx11_
                (&local_30,(void *)sig_type,in_RDX);
      LogOpcode(this,"%s",local_30._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    this->indent_level = this->indent_level + 1;
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeBlockSig(Type sig_type) {
  if (!in_function_body) {
    return Result::Ok;
  }
  if (sig_type != Type::Void) {
    LogOpcode("%s", BlockSigToString(sig_type).c_str());
  } else {
    LogOpcode(nullptr);
  }
  indent_level++;
  return Result::Ok;
}